

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cc
# Opt level: O2

string * __thiscall
bssl::PEMEncode(string *__return_storage_ptr__,bssl *this,string_view data,string *type)

{
  ulong uVar1;
  size_t chunk_offset;
  ulong uVar2;
  bool bVar3;
  string b64_encoded;
  string_view data_local;
  
  data_local._M_str = (char *)data._M_len;
  b64_encoded._M_dataplus._M_p = (pointer)&b64_encoded.field_2;
  b64_encoded._M_string_length = 0;
  b64_encoded.field_2._M_local_buf[0] = '\0';
  data_local._M_len = (size_t)this;
  string_util::Base64Encode(&data_local,(string *)&b64_encoded);
  uVar1 = b64_encoded._M_string_length + 0x3f >> 6;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderBeginBlock);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderTail);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar2 = 0;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    ::std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)&b64_encoded,uVar2);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = uVar2 + 0x40;
  }
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderEndBlock);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ::(anonymous_namespace)::kPEMHeaderTail);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&b64_encoded);
  return __return_storage_ptr__;
}

Assistant:

std::string PEMEncode(std::string_view data, const std::string &type) {
  std::string b64_encoded;
  string_util::Base64Encode(data, &b64_encoded);

  // Divide the Base-64 encoded data into 64-character chunks, as per
  // 4.3.2.4 of RFC 1421.
  static const size_t kChunkSize = 64;
  size_t chunks = (b64_encoded.size() + (kChunkSize - 1)) / kChunkSize;

  std::string pem_encoded;
  pem_encoded.reserve(
      // header & footer
      17 + 15 + type.size() * 2 +
      // encoded data
      b64_encoded.size() +
      // newline characters for line wrapping in encoded data
      chunks);

  pem_encoded = kPEMHeaderBeginBlock;
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");

  for (size_t i = 0, chunk_offset = 0; i < chunks;
       ++i, chunk_offset += kChunkSize) {
    pem_encoded.append(b64_encoded, chunk_offset, kChunkSize);
    pem_encoded.append("\n");
  }

  pem_encoded.append(kPEMHeaderEndBlock);
  pem_encoded.append(type);
  pem_encoded.append(kPEMHeaderTail);
  pem_encoded.append("\n");
  return pem_encoded;
}